

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_registerSequenceProducer(ZSTD_CCtx *zc,void *mState,ZSTD_sequenceProducer_F *mFinder)

{
  if (mFinder == (ZSTD_sequenceProducer_F *)0x0) {
    (zc->externalMatchCtx).seqBuffer = (ZSTD_Sequence *)0x0;
    (zc->externalMatchCtx).seqBufferCapacity = 0;
    (zc->externalMatchCtx).mState = (void *)0x0;
    (zc->externalMatchCtx).mFinder = (ZSTD_sequenceProducer_F *)0x0;
  }
  else {
    (zc->externalMatchCtx).mState = mState;
    (zc->externalMatchCtx).mFinder = mFinder;
    (zc->externalMatchCtx).seqBuffer = (ZSTD_Sequence *)0x0;
    (zc->externalMatchCtx).seqBufferCapacity = 0;
  }
  (zc->requestedParams).useSequenceProducer = (uint)(mFinder != (ZSTD_sequenceProducer_F *)0x0);
  return;
}

Assistant:

void ZSTD_registerSequenceProducer(
    ZSTD_CCtx* zc, void* mState,
    ZSTD_sequenceProducer_F* mFinder
) {
    if (mFinder != NULL) {
        ZSTD_externalMatchCtx emctx;
        emctx.mState = mState;
        emctx.mFinder = mFinder;
        emctx.seqBuffer = NULL;
        emctx.seqBufferCapacity = 0;
        zc->externalMatchCtx = emctx;
        zc->requestedParams.useSequenceProducer = 1;
    } else {
        ZSTD_memset(&zc->externalMatchCtx, 0, sizeof(zc->externalMatchCtx));
        zc->requestedParams.useSequenceProducer = 0;
    }
}